

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatMap.c
# Opt level: O2

int Sbm_AddCardinConstrPairWise(sat_solver *p,Vec_Int_t *vVars,int K)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int **ppiVar4;
  int nVars;
  int local_c;
  
  local_c = vVars->nSize;
  Sbm_AddCardinConstrRange(p,vVars->pArray,0,local_c + -1,&local_c);
  if (p->qhead == p->qtail) {
    iVar2 = p->size;
    p->iVarPivot = iVar2;
    p->iTrailPivot = p->qhead;
    *(undefined8 *)(p->Mem).BookMarkE = *(undefined8 *)(p->Mem).nEntries;
    iVar3 = (p->Mem).iPage[0];
    bVar1 = (byte)(p->Mem).nPageSize;
    ppiVar4 = (p->Mem).pPages;
    (p->Mem).BookMarkH[0] = iVar3 << (bVar1 & 0x1f) | *ppiVar4[iVar3];
    iVar3 = (p->Mem).iPage[1];
    (p->Mem).BookMarkH[1] = iVar3 << (bVar1 & 0x1f) | *ppiVar4[iVar3];
    if (p->activity2 != (uint *)0x0) {
      p->var_inc2 = p->var_inc;
      memcpy(p->activity2,p->activity,(long)iVar2 << 2);
    }
    return local_c;
  }
  __assert_fail("s->qhead == s->qtail",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                ,0x114,"void sat_solver_bookmark(sat_solver *)");
}

Assistant:

int Sbm_AddCardinConstrPairWise( sat_solver * p, Vec_Int_t * vVars, int K )
{
    int nVars = Vec_IntSize(vVars);
    Sbm_AddCardinConstrRange( p, Vec_IntArray(vVars), 0, nVars - 1, &nVars );
    sat_solver_bookmark( p );
    return nVars;
}